

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O2

bool __thiscall ConditionMarker::verifyCondition(ConditionMarker *this,PcodeOp *op,PcodeOp *initop)

{
  bool bVar1;
  int4 iVar2;
  Varnode *vn;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  setupInitOp(this,initop);
  vn = findMatch(this,op);
  if ((vn != (Varnode *)0x0) && (bVar1 = finalJudgement(this,vn), bVar1)) {
    if (this->multion == true) {
      uVar3 = 0;
      uVar5 = (ulong)(uint)this->state;
      if (this->state < 1) {
        uVar5 = uVar3;
      }
      do {
        uVar4 = uVar3;
        if (uVar5 == uVar4) {
          return true;
        }
        uVar3 = uVar4 + 1;
      } while (this->opstate[uVar4]->opcode->opcode != CPUI_MULTIEQUAL);
      iVar2 = this->slotstate[uVar4];
    }
    else {
      iVar2 = -1;
    }
    this->multislot = iVar2;
    return true;
  }
  return false;
}

Assistant:

bool ConditionMarker::verifyCondition(PcodeOp *op,PcodeOp *initop)

{
  setupInitOp(initop);
  Varnode *matchvn = findMatch(op);
  if (matchvn == (Varnode *)0) return false;
  if (!finalJudgement(matchvn)) return false;

  // Make final determination of what MULTIEQUAL slot is used
  if (!multion)
    multislot = -1;
  else {
    for(int4 i=0;i<state;++i)
      if (opstate[i]->code()==CPUI_MULTIEQUAL) {
	multislot = slotstate[i];
	break;
      }
  }
  return true;
}